

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O2

void extend_plane(uint8_t *src,int src_stride,int width,int height,int extend_top,int extend_left,
                 int extend_bottom,int extend_right,int v_start,int v_end)

{
  long lVar1;
  long lVar2;
  int iVar3;
  byte *pbVar4;
  size_t __n;
  size_t __n_00;
  uint8_t *__src;
  uint8_t *puVar5;
  bool bVar6;
  
  pbVar4 = src + v_start * src_stride;
  __n_00 = (size_t)extend_left;
  lVar2 = (long)src_stride;
  for (; v_start < v_end; v_start = v_start + 1) {
    memset(pbVar4 + -__n_00,(uint)*pbVar4,__n_00);
    memset(pbVar4 + width,(uint)(pbVar4 + width)[-1],(long)extend_right);
    pbVar4 = pbVar4 + lVar2;
  }
  __src = src + -__n_00;
  puVar5 = __src + -(src_stride * extend_top);
  __n = (size_t)(extend_left + width + extend_right);
  iVar3 = 0;
  if (0 < extend_top) {
    iVar3 = extend_top;
  }
  while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
    memcpy(puVar5,__src,__n);
    puVar5 = puVar5 + lVar2;
  }
  lVar1 = (long)((height + -1) * src_stride);
  iVar3 = 0;
  if (0 < extend_bottom) {
    iVar3 = extend_bottom;
  }
  puVar5 = src + ((lVar1 + lVar2) - __n_00);
  while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, bVar6) {
    memcpy(puVar5,__src + lVar1,__n);
    puVar5 = puVar5 + lVar2;
  }
  return;
}

Assistant:

static void extend_plane(uint8_t *const src, int src_stride, int width,
                         int height, int extend_top, int extend_left,
                         int extend_bottom, int extend_right, int v_start,
                         int v_end) {
  assert(src != NULL);
  int i;
  const int linesize = extend_left + extend_right + width;
  assert(linesize <= src_stride);

  /* copy the left and right most columns out */
  uint8_t *src_ptr1 = src + v_start * src_stride;
  uint8_t *src_ptr2 = src + v_start * src_stride + width - 1;
  uint8_t *dst_ptr1 = src + v_start * src_stride - extend_left;
  uint8_t *dst_ptr2 = src_ptr2 + 1;

  for (i = v_start; i < v_end; ++i) {
    memset(dst_ptr1, src_ptr1[0], extend_left);
    memset(dst_ptr2, src_ptr2[0], extend_right);
    src_ptr1 += src_stride;
    src_ptr2 += src_stride;
    dst_ptr1 += src_stride;
    dst_ptr2 += src_stride;
  }

  /* Now copy the top and bottom lines into each line of the respective
   * borders
   */
  src_ptr1 = src - extend_left;
  dst_ptr1 = src_ptr1 + src_stride * -extend_top;

  for (i = 0; i < extend_top; ++i) {
    memcpy(dst_ptr1, src_ptr1, linesize);
    dst_ptr1 += src_stride;
  }

  src_ptr2 = src_ptr1 + src_stride * (height - 1);
  dst_ptr2 = src_ptr2;

  for (i = 0; i < extend_bottom; ++i) {
    dst_ptr2 += src_stride;
    memcpy(dst_ptr2, src_ptr2, linesize);
  }
}